

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TPM2_Create(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT parentHandle,
                  TPM2B_SENSITIVE_CREATE *inSensitive,TPM2B_PUBLIC *inPublic,TPM2B_DATA *outsideInfo
                  ,TPML_PCR_SELECTION *creationPCR,TPM2B_PRIVATE *outPrivate,TPM2B_PUBLIC *outPublic
                  ,TPM2B_CREATION_DATA *creationData,TPM2B_DIGEST *creationHash,
                  TPMT_TK_CREATION *creationTicket)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  undefined1 local_326c [8];
  TPMT_TK_CREATION val_2;
  TPM2B_DIGEST val_1;
  TPM2B_CREATION_DATA val;
  void *p_3;
  void *p_2;
  void *p_1;
  void *p;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT *pTStack_3070;
  INT32 sizeParamBuf;
  TSS_CMD_CONTEXT *cmdCtx;
  undefined1 local_3060 [4];
  TPM_RC cmdResult;
  TSS_CMD_CONTEXT CmdCtx;
  TPM2B_DATA *outsideInfo_local;
  TPM2B_PUBLIC *inPublic_local;
  TPM2B_SENSITIVE_CREATE *inSensitive_local;
  TSS_SESSION *pTStack_20;
  TPMI_DH_OBJECT parentHandle_local;
  TSS_SESSION *session_local;
  TSS_DEVICE *tpm_local;
  
  cmdCtx._4_4_ = 0;
  pTStack_3070 = (TSS_CMD_CONTEXT *)local_3060;
  paramBuf._4_4_ = 0x1000;
  p = &cmdResult;
  local_3060 = (undefined1  [4])0x0;
  CmdCtx._12312_8_ = outsideInfo;
  inSensitive_local._4_4_ = parentHandle;
  pTStack_20 = session;
  session_local = (TSS_SESSION *)tpm;
  UVar1 = TPM2B_SENSITIVE_CREATE_Marshal(inSensitive,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3070->ParamSize = (uint)UVar1 + pTStack_3070->ParamSize;
  UVar1 = TPM2B_PUBLIC_Marshal(inPublic,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3070->ParamSize = (uint)UVar1 + pTStack_3070->ParamSize;
  UVar1 = TPM2B_DATA_Marshal((TPM2B_DATA *)CmdCtx._12312_8_,(BYTE **)&p,
                             (INT32 *)((long)&paramBuf + 4));
  pTStack_3070->ParamSize = (uint)UVar1 + pTStack_3070->ParamSize;
  val.creationData._304_8_ = creationPCR;
  UVar1 = TPML_PCR_SELECTION_Marshal(creationPCR,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3070->ParamSize = (uint)UVar1 + pTStack_3070->ParamSize;
  cmdCtx._4_4_ = TSS_DispatchCmd((TSS_DEVICE *)session_local,0x153,
                                 (TPM_HANDLE *)((long)&inSensitive_local + 4),1,
                                 &stack0xffffffffffffffe0,1,pTStack_3070);
  tpm_local._4_4_ = cmdCtx._4_4_;
  if (cmdCtx._4_4_ == 0) {
    TVar2 = TPM2B_PRIVATE_Unmarshal
                      (outPrivate,&pTStack_3070->RespBufPtr,(INT32 *)&pTStack_3070->RespBytesLeft);
    if (TVar2 == 0) {
      TVar2 = TPM2B_PUBLIC_Unmarshal
                        (outPublic,&pTStack_3070->RespBufPtr,(INT32 *)&pTStack_3070->RespBytesLeft,1
                        );
      if (TVar2 == 0) {
        if (creationData == (TPM2B_CREATION_DATA *)0x0) {
          TVar2 = TPM2B_CREATION_DATA_Unmarshal
                            ((TPM2B_CREATION_DATA *)(val_1.t.buffer + 0x38),
                             &pTStack_3070->RespBufPtr,(INT32 *)&pTStack_3070->RespBytesLeft);
          if (TVar2 != 0) {
            return 0x9a;
          }
        }
        else {
          TVar2 = TPM2B_CREATION_DATA_Unmarshal
                            (creationData,&pTStack_3070->RespBufPtr,
                             (INT32 *)&pTStack_3070->RespBytesLeft);
          if (TVar2 != 0) {
            return 0x9a;
          }
        }
        if (creationHash == (TPM2B_DIGEST *)0x0) {
          TVar2 = TPM2B_DIGEST_Unmarshal
                            ((TPM2B_DIGEST *)((long)&val_2.digest + 0x3e),&pTStack_3070->RespBufPtr,
                             (INT32 *)&pTStack_3070->RespBytesLeft);
          if (TVar2 != 0) {
            return 0x9a;
          }
        }
        else {
          TVar2 = TPM2B_DIGEST_Unmarshal
                            (creationHash,&pTStack_3070->RespBufPtr,
                             (INT32 *)&pTStack_3070->RespBytesLeft);
          if (TVar2 != 0) {
            return 0x9a;
          }
        }
        if (creationTicket == (TPMT_TK_CREATION *)0x0) {
          TVar2 = TPMT_TK_CREATION_Unmarshal
                            ((TPMT_TK_CREATION *)local_326c,&pTStack_3070->RespBufPtr,
                             (INT32 *)&pTStack_3070->RespBytesLeft);
          if (TVar2 != 0) {
            return 0x9a;
          }
        }
        else {
          TVar2 = TPMT_TK_CREATION_Unmarshal
                            (creationTicket,&pTStack_3070->RespBufPtr,
                             (INT32 *)&pTStack_3070->RespBytesLeft);
          if (TVar2 != 0) {
            return 0x9a;
          }
        }
        tpm_local._4_4_ = cmdCtx._4_4_;
      }
      else {
        tpm_local._4_4_ = 0x9a;
      }
    }
    else {
      tpm_local._4_4_ = 0x9a;
    }
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TPM2_Create(
    TSS_DEVICE               *tpm,              // IN/OUT
    TSS_SESSION              *session,          // IN/OUT
    TPMI_DH_OBJECT            parentHandle,     // IN
    TPM2B_SENSITIVE_CREATE   *inSensitive,      // IN
    TPM2B_PUBLIC             *inPublic,         // IN
    TPM2B_DATA               *outsideInfo,      // IN
    TPML_PCR_SELECTION       *creationPCR,      // IN
    TPM2B_PRIVATE            *outPrivate,       // OUT
    TPM2B_PUBLIC             *outPublic,        // OUT
    TPM2B_CREATION_DATA      *creationData,     // OUT
    TPM2B_DIGEST             *creationHash,     // OUT
    TPMT_TK_CREATION         *creationTicket    // OUT
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL(TPM2B_SENSITIVE_CREATE, inSensitive);
    TSS_MARSHAL(TPM2B_PUBLIC, inPublic);
    TSS_MARSHAL(TPM2B_DATA, outsideInfo);
    TSS_MARSHAL(TPML_PCR_SELECTION, creationPCR);
    DISPATCH_CMD(Create, &parentHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_PRIVATE, outPrivate);
    TSS_UNMARSHAL_FLAGGED(TPM2B_PUBLIC, outPublic);
    TSS_UNMARSHAL_OPT(TPM2B_CREATION_DATA, creationData);
    TSS_UNMARSHAL_OPT(TPM2B_DIGEST, creationHash);
    TSS_UNMARSHAL_OPT(TPMT_TK_CREATION, creationTicket);
    END_CMD();
}